

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_map.cc
# Opt level: O1

string_view bloaty::sourcemap::ReadQuotedString(string_view *data)

{
  Arg *in_R9;
  string_view sVar1;
  string_view format;
  string local_88;
  Arg local_68;
  undefined8 local_38;
  char *local_30;
  
  if (data->_M_len == 0) {
    local_38 = 3;
    local_30 = "EOF";
  }
  else {
    local_30 = data->_M_str;
    if (*local_30 == '\"') {
      data->_M_str = local_30 + 1;
      data->_M_len = data->_M_len - 1;
      sVar1 = ReadUntilConsuming(data,'\"');
      return sVar1;
    }
    local_38 = 1;
  }
  local_68.piece_._M_str = local_68.scratch_;
  local_68.piece_._M_len = 1;
  local_68.scratch_[0] = '\"';
  format._M_str = (char *)&local_38;
  format._M_len = (size_t)"unexpected \'$0\', expected \'$1\'";
  absl::Substitute_abi_cxx11_(&local_88,(absl *)0x1e,format,&local_68,in_R9);
  Throw(local_88._M_dataplus._M_p,0xb7);
}

Assistant:

std::unique_ptr<ObjectFile> TryOpenSourceMapFile(
    std::unique_ptr<InputFile>& file, std::string build_id) {
  std::string_view data = file->data();
  if (sourcemap::ReadOpeningBrace(&data)) {
    return std::unique_ptr<ObjectFile>(
        new sourcemap::SourceMapObjectFile(std::move(file), build_id));
  }

  return nullptr;
}